

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O2

void __thiscall tcmalloc::CentralFreeList::ReleaseToSpans(CentralFreeList *this,void *object)

{
  uint uVar1;
  short sVar2;
  Span *span;
  
  if (((ulong)object >> 0x30 == 0) &&
     (*(long *)(Static::pageheap_ + ((ulong)object >> 0x1f) * 8 + 0x80010) != 0)) {
    span = *(Span **)(*(long *)(Static::pageheap_ + ((ulong)object >> 0x1f) * 8 + 0x80010) +
                     (ulong)((uint)((ulong)object >> 0xd) & 0x3ffff) * 8);
  }
  else {
    span = (Span *)0x0;
  }
  if ((span->field_4).objects == (void *)0x0) {
    DLL_Remove(span);
    DLL_Prepend(&this->nonempty_,span);
  }
  this->counter_ = this->counter_ + 1;
  uVar1 = *(uint *)&span->field_0x28;
  sVar2 = (short)uVar1 + -1;
  *(short *)&span->field_0x28 = sVar2;
  if (sVar2 != 0) {
    *(anon_union_8_2_4d86d181_for_Span_4 *)object = span->field_4;
    (span->field_4).objects = object;
    return;
  }
  this->counter_ =
       this->counter_ -
       (span->length << 0xd) /
       (ulong)(long)*(int *)((long)&DAT_0012ea44 + (ulong)(uVar1 >> 0xe & 0x3fc));
  DLL_Remove(span);
  this->num_spans_ = this->num_spans_ - 1;
  SpinLock::Unlock(&this->lock_);
  PageHeap::Delete((PageHeap *)Static::pageheap_,span);
  SpinLock::Lock(&this->lock_);
  return;
}

Assistant:

void CentralFreeList::ReleaseToSpans(void* object) {
  const PageID p = reinterpret_cast<uintptr_t>(object) >> kPageShift;
  Span* span = Static::pageheap()->GetDescriptor(p);
  ASSERT(span != nullptr);
  ASSERT(span->refcount > 0);

  // If span is empty, move it to non-empty list
  if (span->objects == nullptr) {
    tcmalloc::DLL_Remove(span);
    tcmalloc::DLL_Prepend(&nonempty_, span);
  }

  // The following check is expensive, so it is disabled by default
  if (false) {
    // Check that object does not occur in list
    int got = 0;
    for (void* p = span->objects; p != nullptr; p = *((void**) p)) {
      ASSERT(p != object);
      got++;
    }
    (void)got;
    ASSERT(got + span->refcount ==
           (span->length<<kPageShift) /
           Static::sizemap()->ByteSizeForClass(span->sizeclass));
  }

  counter_++;
  span->refcount--;
  if (span->refcount == 0) {
    counter_ -= ((span->length<<kPageShift) /
                 Static::sizemap()->ByteSizeForClass(span->sizeclass));
    tcmalloc::DLL_Remove(span);
    --num_spans_;

    // Release central list lock while operating on pageheap
    lock_.Unlock();
    Static::pageheap()->Delete(span);
    lock_.Lock();
  } else {
    *(reinterpret_cast<void**>(object)) = span->objects;
    span->objects = object;
  }
}